

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

dgConvexHull3d * __thiscall
dgMeshEffect::CreateConvexHull(dgMeshEffect *this,HaF64 tolerance,HaI32 maxVertexCount)

{
  dgBigVector *pdVar1;
  dgBigVector *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  HaI32 HVar6;
  dgBigVector *vertexCloud;
  dgEdge *pdVar7;
  dgConvexHull3d *this_00;
  dgEdge *pdVar8;
  long lVar9;
  int count;
  dgStack<dgBigVector> poolPtr;
  Iterator local_40;
  
  dgStack<dgBigVector>::dgStack(&poolPtr,*(int *)&(this->super_dgRefCounter).field_0xc * 2);
  count = 0;
  vertexCloud = dgStack<dgBigVector>::operator[](&poolPtr,0);
  HVar6 = dgPolyhedra::IncLRU(&this->super_dgPolyhedra);
  local_40.m_tree = (dgTree<dgEdge,_long> *)this;
  local_40.m_ptr = &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this)->super_dgRedBackNode
  ;
  while ((dgTreeNode *)local_40.m_ptr != (dgTreeNode *)0x0) {
    if (((dgEdge *)((long)local_40.m_ptr + 0x28))->m_mark != HVar6) {
      pdVar7 = (dgEdge *)((long)local_40.m_ptr + 0x28);
      pdVar8 = pdVar7;
      do {
        pdVar8->m_mark = HVar6;
        pdVar8 = pdVar8->m_twin->m_next;
      } while (pdVar8 != pdVar7);
      if (count < poolPtr.m_size) {
        lVar9 = (long)count;
        count = count + 1;
        pdVar1 = this->m_points + pdVar7->m_incidentVertex;
        dVar3 = (pdVar1->super_dgTemplateVector<double>).m_y;
        dVar4 = (pdVar1->super_dgTemplateVector<double>).m_z;
        dVar5 = (pdVar1->super_dgTemplateVector<double>).m_w;
        pdVar2 = vertexCloud + lVar9;
        (pdVar2->super_dgTemplateVector<double>).m_x = (pdVar1->super_dgTemplateVector<double>).m_x;
        (pdVar2->super_dgTemplateVector<double>).m_y = dVar3;
        (pdVar2->super_dgTemplateVector<double>).m_z = dVar4;
        (pdVar2->super_dgTemplateVector<double>).m_w = dVar5;
      }
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_40,0);
  }
  this_00 = (dgConvexHull3d *)malloc(0x48);
  dgConvexHull3d::dgConvexHull3d(this_00,(HaF64 *)vertexCloud,0x20,count,tolerance,maxVertexCount);
  free(poolPtr.super_dgStackBase.m_ptr);
  return this_00;
}

Assistant:

dgConvexHull3d * dgMeshEffect::CreateConvexHull(hacd::HaF64 tolerance,hacd::HaI32 maxVertexCount) const
{
	dgConvexHull3d *ret = NULL;

	dgStack<dgBigVector> poolPtr(m_pointCount * 2); 
	dgBigVector* const pool = &poolPtr[0];

	hacd::HaI32 count = 0;
	hacd::HaI32 mark = IncLRU();
	dgPolyhedra::Iterator iter (*this);
	for (iter.Begin(); iter; iter ++)
	{
		dgEdge* const vertex = &(*iter);
		if (vertex->m_mark != mark) 
		{
			dgEdge* ptr = vertex;
			do {
				ptr->m_mark = mark;
				ptr = ptr->m_twin->m_next;
			} while (ptr != vertex);

			if (count < hacd::HaI32 (poolPtr.GetElementsCount())) 
			{
				const dgBigVector p = m_points[vertex->m_incidentVertex];
				pool[count] = p;
				count++;
			}
		}
	}

	ret = HACD_NEW(dgConvexHull3d)((const hacd::HaF64 *)pool,sizeof(dgBigVector),count,tolerance,maxVertexCount);

	return ret;
}